

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O2

void ourWriteOutJSON(writeoutvar *mappings,CURL *curl,per_transfer *per,FILE *stream)

{
  CURLINFO CVar1;
  char *pcVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  jsontype *pjVar7;
  char *name;
  bool bVar8;
  char *local_48;
  CURL *local_40;
  per_transfer *local_38;
  
  local_38 = per;
  fputs("{",(FILE *)stream);
  pjVar7 = &mappings->jsontype;
  local_40 = curl;
  do {
    pcVar2 = ((writeoutvar *)(pjVar7 + -5))->name;
    if (pcVar2 == (char *)0x0) {
      uVar4 = curl_version();
      curl_mfprintf(stream,"\"curl_version\":\"%s\"}",uVar4);
      return;
    }
    if ((pjVar7[-2] == 1) || (5 < *pjVar7 - JSON_STRING)) goto LAB_0011cc7a;
    CVar1 = pjVar7[-1];
    switch(*pjVar7) {
    case JSON_STRING:
      local_48 = (char *)0x0;
      bVar8 = false;
      iVar3 = curl_easy_getinfo(curl,CVar1,&local_48);
      if ((iVar3 == 0) && (local_48 != (char *)0x0)) {
        curl_mfprintf(stream,"\"%s\":\"",pcVar2);
        jsonEscape(stream,local_48);
        curl_mfprintf(stream,"\"");
LAB_0011cb97:
        bVar8 = true;
      }
      break;
    case JSON_LONG:
      if (pjVar7[-3] != VAR_NUM_HEADERS) {
        local_48 = (char *)0x0;
        iVar3 = curl_easy_getinfo(curl,CVar1,&local_48);
        if (iVar3 == 0) {
          curl_mfprintf(stream,"\"%s\":%ld",pcVar2,local_48);
        }
        bVar8 = iVar3 == 0;
        curl = local_40;
        break;
      }
      curl_mfprintf(stream,"\"%s\":%ld",pcVar2,local_38->num_headers);
      goto LAB_0011cc6b;
    case JSON_OFFSET:
      local_48 = (char *)0x0;
      bVar8 = false;
      iVar3 = curl_easy_getinfo(curl,CVar1,&local_48);
      if (iVar3 == 0) {
        pcVar6 = "\"%s\":%ld";
        pcVar5 = local_48;
LAB_0011cb46:
        curl_mfprintf(stream,pcVar6,pcVar2,pcVar5);
        goto LAB_0011cb97;
      }
      break;
    case JSON_TIME:
      local_48 = (char *)0x0;
      bVar8 = false;
      iVar3 = curl_easy_getinfo(curl,CVar1,&local_48);
      if (iVar3 == 0) {
        curl_mfprintf(stream,"\"%s\":%ld.%06ld",pcVar2,(long)local_48 / 1000000,
                      (long)local_48 % 1000000);
        goto LAB_0011cb97;
      }
      break;
    case JSON_VERSION:
      local_48 = (char *)0x0;
      bVar8 = false;
      iVar3 = curl_easy_getinfo(curl,CVar1,&local_48);
      if (local_48 < (char *)0x5 && iVar3 == 0) {
        pcVar6 = "\"%s\":\"%s\"";
        pcVar5 = http_version_rel + *(int *)(http_version_rel + (long)local_48 * 4);
        goto LAB_0011cb46;
      }
      break;
    case JSON_FILENAME:
      pcVar5 = (local_38->outs).filename;
      if (pcVar5 == (char *)0x0) {
        curl_mfprintf(stream,"\"%s\":null",pcVar2);
        curl = local_40;
      }
      else {
        curl_mfprintf(stream,"\"%s\":\"",pcVar2);
        jsonEscape(stream,pcVar5);
        curl_mfprintf(stream,"\"");
        curl = local_40;
      }
      goto LAB_0011cc6b;
    }
    if (bVar8) {
LAB_0011cc6b:
      fputs(",",(FILE *)stream);
    }
LAB_0011cc7a:
    pjVar7 = pjVar7 + 6;
  } while( true );
}

Assistant:

void ourWriteOutJSON(const struct writeoutvar mappings[], CURL *curl,
                     struct per_transfer *per, FILE *stream)
{
  int i;

  fputs("{", stream);
  for(i = 0; mappings[i].name != NULL; i++) {
    const struct writeoutvar *wovar = &mappings[i];
    const char *name = mappings[i].name;
    CURLINFO cinfo = mappings[i].cinfo;
    int ok = 0;

    if(mappings[i].is_ctrl == 1) {
      continue;
    }

    switch(mappings[i].jsontype) {
    case JSON_STRING:
      ok = writeString(stream, curl, name, cinfo);
      break;
    case JSON_LONG:
      ok = writeLong(stream, curl, name, cinfo, per, wovar);
      break;
    case JSON_OFFSET:
      ok = writeOffset(stream, curl, name, cinfo);
      break;
    case JSON_TIME:
      ok = writeTime(stream, curl, name, cinfo);
      break;
    case JSON_FILENAME:
      ok = writeFilename(stream, name, per->outs.filename);
      break;
    case JSON_VERSION:
      ok = writeVersion(stream, curl, name, cinfo);
      break;
    default:
      break;
    }

    if(ok) {
      fputs(",", stream);
    }
  }

  fprintf(stream, "\"curl_version\":\"%s\"}", curl_version());
}